

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.h
# Opt level: O0

void __thiscall Assimp::ColladaExporter::Material::Material(Material *this)

{
  Material *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->shading_model);
  Surface::Surface(&this->ambient);
  Surface::Surface(&this->diffuse);
  Surface::Surface(&this->specular);
  Surface::Surface(&this->emissive);
  Surface::Surface(&this->reflective);
  Surface::Surface(&this->transparent);
  Surface::Surface(&this->normal);
  Property::Property(&this->shininess);
  Property::Property(&this->transparency);
  Property::Property(&this->index_refraction);
  return;
}

Assistant:

Material() {}